

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXDocument.cpp
# Opt level: O0

void __thiscall Assimp::FBX::Object::~Object(Object *this)

{
  Object *this_local;
  
  ~Object(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

Object::~Object()
{
    // empty
}